

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

bool __thiscall
re2::PCRE::DoMatchImpl
          (PCRE *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n,int *vec,
          int vecsize)

{
  int iVar1;
  undefined4 in_register_0000008c;
  
  if (vecsize < n * 3 + 3) {
    __assert_fail("(1 + n) * 3 <= vecsize",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                  0x256,
                  "bool re2::PCRE::DoMatchImpl(const StringPiece &, Anchor, int *, const Arg *const *, int, int *, int) const"
                 );
  }
  iVar1 = TryMatch(this,text,anchor,anchor,false,(int *)CONCAT44(in_register_0000008c,n),vecsize);
  if (iVar1 < 0) {
    __assert_fail("matches >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                  600,
                  "bool re2::PCRE::DoMatchImpl(const StringPiece &, Anchor, int *, const Arg *const *, int, int *, int) const"
                 );
  }
  if (iVar1 != 0) {
    *consumed = vec[1];
  }
  return iVar1 != 0 && (n < 1 || args == (Arg **)0x0);
}

Assistant:

bool PCRE::DoMatchImpl(const StringPiece& text,
                     Anchor anchor,
                     int* consumed,
                     const Arg* const* args,
                     int n,
                     int* vec,
                     int vecsize) const {
  assert((1 + n) * 3 <= vecsize);  // results + PCRE workspace
  int matches = TryMatch(text, 0, anchor, true, vec, vecsize);
  assert(matches >= 0);  // TryMatch never returns negatives
  if (matches == 0)
    return false;

  *consumed = vec[1];

  if (n == 0 || args == NULL) {
    // We are not interested in results
    return true;
  }
  if (NumberOfCapturingGroups() < n) {
    // PCRE has fewer capturing groups than number of arg pointers passed in
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  // We do not need (can not do) any more checks on the value of 'matches' here
  // -- see the comment for TryMatch.
  for (int i = 0; i < n; i++) {
    const int start = vec[2*(i+1)];
    const int limit = vec[2*(i+1)+1];
    if (!args[i]->Parse(text.data() + start, limit-start)) {
      // TODO: Should we indicate what the error was?
      return false;
    }
  }

  return true;
}